

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.h
# Opt level: O0

void __thiscall SignatureData::SignatureData(SignatureData *this)

{
  long lVar1;
  undefined1 *in_RDI;
  long in_FS_OFFSET;
  TaprootSpendData *in_stack_ffffffffffffff58;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = 0;
  in_RDI[1] = 0;
  CScript::CScript((CScript *)in_stack_ffffffffffffff58);
  CScript::CScript((CScript *)in_stack_ffffffffffffff58);
  CScript::CScript((CScript *)in_stack_ffffffffffffff58);
  CScriptWitness::CScriptWitness((CScriptWitness *)in_stack_ffffffffffffff58);
  TaprootSpendData::TaprootSpendData(in_stack_ffffffffffffff58);
  std::optional<TaprootBuilder>::optional((optional<TaprootBuilder> *)in_stack_ffffffffffffff58);
  std::
  map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  ::map((map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
         *)in_stack_ffffffffffffff58);
  std::
  map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  ::map((map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
         *)in_stack_ffffffffffffff58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff58);
  std::
  map<std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::pair<XOnlyPubKey,_uint256>_>,_std::allocator<std::pair<const_std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::map((map<std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::pair<XOnlyPubKey,_uint256>_>,_std::allocator<std::pair<const_std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         *)in_stack_ffffffffffffff58);
  std::
  map<XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
  ::map((map<XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
         *)in_stack_ffffffffffffff58);
  std::
  map<CKeyID,_XOnlyPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_XOnlyPubKey>_>_>
  ::map((map<CKeyID,_XOnlyPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_XOnlyPubKey>_>_>
         *)in_stack_ffffffffffffff58);
  std::vector<CKeyID,_std::allocator<CKeyID>_>::vector
            ((vector<CKeyID,_std::allocator<CKeyID>_> *)in_stack_ffffffffffffff58);
  std::vector<CKeyID,_std::allocator<CKeyID>_>::vector
            ((vector<CKeyID,_std::allocator<CKeyID>_> *)in_stack_ffffffffffffff58);
  uint160::uint160((uint160 *)in_stack_ffffffffffffff58);
  uint256::uint256((uint256 *)in_stack_ffffffffffffff58);
  std::
  map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::map((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         *)in_stack_ffffffffffffff58);
  std::
  map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::map((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         *)in_stack_ffffffffffffff58);
  std::
  map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::map((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         *)in_stack_ffffffffffffff58);
  std::
  map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::map((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         *)in_stack_ffffffffffffff58);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SignatureData() = default;